

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O3

void __thiscall
QtPrivate::QGenericArrayOps<VkSpecParser::Command>::copyAppend
          (QGenericArrayOps<VkSpecParser::Command> *this,Command *b,Command *e)

{
  Command *pCVar1;
  Data *pDVar2;
  Data *pDVar3;
  long lVar4;
  
  if ((b != e) && (b < e)) {
    pCVar1 = (this->super_QArrayDataPointer<VkSpecParser::Command>).ptr;
    lVar4 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size;
    do {
      pDVar2 = (b->cmd).name.d.d;
      pCVar1[lVar4].cmd.name.d.d = pDVar2;
      pCVar1[lVar4].cmd.name.d.ptr = (b->cmd).name.d.ptr;
      pCVar1[lVar4].cmd.name.d.size = (b->cmd).name.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value =
             (Type)((int)(pDVar2->super_QArrayData).ref_._q_value + 1);
        UNLOCK();
      }
      pDVar2 = (b->cmd).type.d.d;
      pCVar1[lVar4].cmd.type.d.d = pDVar2;
      pCVar1[lVar4].cmd.type.d.ptr = (b->cmd).type.d.ptr;
      pCVar1[lVar4].cmd.type.d.size = (b->cmd).type.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar2 = (b->cmd).typeSuffix.d.d;
      pCVar1[lVar4].cmd.typeSuffix.d.d = pDVar2;
      pCVar1[lVar4].cmd.typeSuffix.d.ptr = (b->cmd).typeSuffix.d.ptr;
      pCVar1[lVar4].cmd.typeSuffix.d.size = (b->cmd).typeSuffix.d.size;
      if (pDVar2 != (Data *)0x0) {
        LOCK();
        (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pDVar3 = (b->args).d.d;
      pCVar1[lVar4].args.d.d = pDVar3;
      pCVar1[lVar4].args.d.ptr = (b->args).d.ptr;
      pCVar1[lVar4].args.d.size = (b->args).d.size;
      if (pDVar3 != (Data *)0x0) {
        LOCK();
        (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
             (pDVar3->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + 1;
        UNLOCK();
      }
      pCVar1[lVar4].deviceLevel = b->deviceLevel;
      b = b + 1;
      lVar4 = (this->super_QArrayDataPointer<VkSpecParser::Command>).size + 1;
      (this->super_QArrayDataPointer<VkSpecParser::Command>).size = lVar4;
    } while (b < e);
  }
  return;
}

Assistant:

void copyAppend(const T *b, const T *e)
    {
        Q_ASSERT(this->isMutable() || b == e);
        Q_ASSERT(!this->isShared() || b == e);
        Q_ASSERT(b <= e);
        Q_ASSERT((e - b) <= this->freeSpaceAtEnd());

        if (b == e) // short-cut and handling the case b and e == nullptr
            return;

        T *data = this->begin();
        while (b < e) {
            new (data + this->size) T(*b);
            ++b;
            ++this->size;
        }
    }